

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O2

bool __thiscall
binlog::SessionWriter::addEvent<boost::scoped_ptr<bool>,boost::shared_ptr<int>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,scoped_ptr<bool> *args,
          shared_ptr<int> *args_1)

{
  size_t size;
  QueueWriter *this_00;
  char **ppcVar1;
  char *pcVar2;
  Queue *pQVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long local_58 [2];
  uint local_48;
  undefined4 uStack_44;
  uint uStack_40;
  undefined4 uStack_3c;
  
  local_58[0] = 8;
  local_58[1] = 8;
  uVar7 = -(uint)((int)args->px == 0 && (int)((ulong)args->px >> 0x20) == 0);
  uVar8 = -(uint)((int)args_1->px == 0 && (int)((ulong)args_1->px >> 0x20) == 0);
  local_48 = uVar7 & 1 | ~uVar7 & 2;
  uStack_44 = 0;
  uStack_40 = uVar8 & 1 | ~uVar8 & 5;
  uStack_3c = 0;
  lVar6 = 0;
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 8) {
    lVar6 = lVar6 + *(long *)((long)local_58 + lVar5);
  }
  size = lVar6 + 4;
  this_00 = &this->_qw;
  bVar4 = detail::QueueWriter::beginWrite(this_00,size);
  if (!bVar4) {
    replaceChannel(this,size);
    bVar4 = detail::QueueWriter::beginWrite(this_00,size);
    if (!bVar4) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)lVar6;
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 4;
  *(uint64_t *)(pcVar2 + 4) = eventSourceId;
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 8;
  *(uint64_t *)(pcVar2 + 8) = clock;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 8;
  mserialize::detail::BuiltinSerializer<boost::scoped_ptr<bool>,_void>::
  serialize<binlog::detail::QueueWriter>(args,this_00);
  mserialize::detail::BuiltinSerializer<boost::shared_ptr<int>,_void>::
  serialize<binlog::detail::QueueWriter>(args_1,this_00);
  pQVar3 = (this->_qw)._queue;
  (pQVar3->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar3->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}